

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O2

AssertionResult * __thiscall
iutest::internal::CmpHelperEQ<bool,iutest::TestFlag::Fragment<8192>>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expected_str,
          char *actual_str,bool *expected,Fragment<8192> *actual)

{
  bool bVar1;
  Fragment<8192> *v;
  string sStack_68;
  string local_48;
  
  bVar1 = iuOperatorEQ<iutest::TestFlag::Fragment<8192>,bool>
                    ((Fragment<8192> *)expected,(bool *)actual_str);
  if (bVar1) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    PrintToString<bool>(&local_48,(bool *)actual_str);
    PrintToString<iutest::TestFlag::Fragment<8192>>(&sStack_68,(iutest *)expected,v);
    EqFailure(__return_storage_ptr__,(char *)this,expected_str,&local_48,&sStack_68,false);
    std::__cxx11::string::~string((string *)&sStack_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( iuOperatorEQ(actual, expected) )
    {
        return AssertionSuccess();
    }